

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O0

bool __thiscall
acto::actor_ref::send_message
          (actor_ref *this,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  object_t *poVar1;
  runtime_t *this_00;
  ssize_t sVar2;
  runtime_t *__n;
  int in_R8D;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_20;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *local_18;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg_local;
  actor_ref *this_local;
  
  local_18 = msg;
  msg_local = (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)this;
  this_00 = core::runtime_t::instance();
  poVar1 = this->object_;
  __n = this_00;
  std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::unique_ptr
            (&local_20,msg);
  sVar2 = core::runtime_t::send(this_00,(int)poVar1,&local_20,(size_t)__n,in_R8D);
  std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
            (&local_20);
  return (bool)((byte)sVar2 & 1);
}

Assistant:

bool actor_ref::send_message(std::unique_ptr<core::msg_t> msg) const {
  return core::runtime_t::instance()->send(object_, std::move(msg));
}